

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void __thiscall re2::CharClassBuilder::AddCharClass(CharClassBuilder *this,CharClassBuilder *cc)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (cc->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(cc->ranges_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    AddRange(this,p_Var1[1]._M_color,*(Rune *)&p_Var1[1].field_0x4);
  }
  return;
}

Assistant:

void CharClassBuilder::AddCharClass(CharClassBuilder *cc) {
  for (iterator it = cc->begin(); it != cc->end(); ++it)
    AddRange(it->lo, it->hi);
}